

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

EnumDescriptor * __thiscall google::protobuf::FieldDescriptor::enum_type(FieldDescriptor *this)

{
  once_flag *control;
  FieldDescriptor *local_10;
  
  if (this->type_ == '\x0e') {
    control = this->type_once_;
    if ((control != (once_flag *)0x0) &&
       ((control->control_).super___atomic_base<unsigned_int>._M_i != 0xdd)) {
      local_10 = this;
      absl::lts_20250127::base_internal::
      CallOnceImpl<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (&control->control_,SCHEDULE_COOPERATIVE_AND_KERNEL,TypeOnceInit,&local_10);
    }
    return (EnumDescriptor *)(this->type_descriptor_).message_type;
  }
  return (EnumDescriptor *)0x0;
}

Assistant:

const EnumDescriptor* FieldDescriptor::enum_type() const {
  if (type_ == TYPE_ENUM) {
    if (type_once_) {
      absl::call_once(*type_once_, FieldDescriptor::TypeOnceInit, this);
    }
    return type_descriptor_.enum_type;
  }
  return nullptr;
}